

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_unique(lyout *out,int level,lys_module *module,lys_unique *uniq)

{
  char *value;
  char *pcVar1;
  ulong uVar2;
  
  ly_print(out,"%*s<unique tag=\"",(ulong)(uint)(level * 2),"");
  if (uniq->expr_size != '\0') {
    uVar2 = 0;
    do {
      value = transform_json2schema(module,uniq->expr[uVar2]);
      uVar2 = uVar2 + 1;
      pcVar1 = "";
      if (uVar2 < uniq->expr_size) {
        pcVar1 = " ";
      }
      ly_print(out,"%s%s",value,pcVar1);
      lydict_remove(module->ctx,value);
    } while (uVar2 < uniq->expr_size);
  }
  ly_print(out,"\"");
  return;
}

Assistant:

static void
yin_print_unique(struct lyout *out, int level, const struct lys_module *module, const struct lys_unique *uniq)
{
    int i;
    const char *str;

    ly_print(out, "%*s<unique tag=\"", LEVEL, INDENT);
    for (i = 0; i < uniq->expr_size; i++) {
        str = transform_json2schema(module, uniq->expr[i]);
        ly_print(out, "%s%s", str, i + 1 < uniq->expr_size ? " " : "");
        lydict_remove(module->ctx, str);
    }
    ly_print(out, "\"");
}